

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Btree * findBtree(sqlite3 *pErrorDb,sqlite3 *pDb,char *zDb)

{
  long lVar1;
  int iVar2;
  int iVar3;
  sqlite3 *in_RDX;
  long in_RSI;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  int rc;
  int i;
  Parse sParse;
  sqlite3 *in_stack_fffffffffffffe18;
  sqlite3 *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  int iVar4;
  undefined4 in_stack_fffffffffffffe2c;
  Btree *local_1b8;
  undefined1 local_1b0 [8];
  undefined8 local_1a8;
  uint local_198;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = sqlite3FindDbName(in_RDX,(char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                    in_stack_fffffffffffffe28));
  if (iVar2 == 1) {
    memset(local_1b0,0xaa,0x1a8);
    iVar4 = 0;
    sqlite3ParseObjectInit((Parse *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    iVar3 = sqlite3OpenTempDatabase((Parse *)CONCAT44(iVar2,iVar4));
    if (iVar3 != 0) {
      sqlite3ErrorWithMsg(in_RDI,(int)(ulong)local_198,"%s",local_1a8);
      iVar4 = 1;
    }
    sqlite3DbFree(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    sqlite3ParseObjectReset((Parse *)in_RDX);
    if (iVar4 != 0) {
      local_1b8 = (Btree *)0x0;
      goto LAB_0013b6cd;
    }
  }
  if (iVar2 < 0) {
    sqlite3ErrorWithMsg(in_RDI,1,"unknown database %s",in_RDX);
    local_1b8 = (Btree *)0x0;
  }
  else {
    local_1b8 = *(Btree **)(*(long *)(in_RSI + 0x20) + (long)iVar2 * 0x20 + 8);
  }
LAB_0013b6cd:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_1b8;
}

Assistant:

static Btree *findBtree(sqlite3 *pErrorDb, sqlite3 *pDb, const char *zDb){
  int i = sqlite3FindDbName(pDb, zDb);

  if( i==1 ){
    Parse sParse;
    int rc = 0;
    sqlite3ParseObjectInit(&sParse,pDb);
    if( sqlite3OpenTempDatabase(&sParse) ){
      sqlite3ErrorWithMsg(pErrorDb, sParse.rc, "%s", sParse.zErrMsg);
      rc = SQLITE_ERROR;
    }
    sqlite3DbFree(pErrorDb, sParse.zErrMsg);
    sqlite3ParseObjectReset(&sParse);
    if( rc ){
      return 0;
    }
  }

  if( i<0 ){
    sqlite3ErrorWithMsg(pErrorDb, SQLITE_ERROR, "unknown database %s", zDb);
    return 0;
  }

  return pDb->aDb[i].pBt;
}